

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushFocusScope(ImGuiID id)

{
  ImGuiWindow *pIVar1;
  
  pIVar1 = GImGui->CurrentWindow;
  ImVector<unsigned_int>::push_back(&pIVar1->IDStack,&(pIVar1->DC).NavFocusScopeIdCurrent);
  (pIVar1->DC).NavFocusScopeIdCurrent = id;
  return;
}

Assistant:

void ImGui::PushFocusScope(ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    window->IDStack.push_back(window->DC.NavFocusScopeIdCurrent);
    window->DC.NavFocusScopeIdCurrent = id;
}